

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

CTState * lj_ctype_init(lua_State *L)

{
  uint uVar1;
  uint uVar2;
  CTState *pCVar3;
  CType *pCVar4;
  size_t lenx;
  GCstr *pGVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  char *__s;
  
  lVar8 = 0;
  pCVar3 = (CTState *)lj_mem_realloc(L,(void *)0x0,0,0x1d0);
  pCVar4 = (CType *)lj_mem_realloc(L,(void *)0x0,0,0x800);
  memset(&pCVar3->g,0,0x1b8);
  pCVar3->tab = pCVar4;
  pCVar3->top = 0x60;
  pCVar3->sizetab = 0x80;
  pCVar3->L = (lua_State *)0x0;
  pCVar3->g = (global_State *)(ulong)(L->glref).ptr32;
  __s = "va_list";
  lVar7 = 0;
  do {
    uVar2 = *(uint *)((long)lj_ctype_typeinfo + lVar8);
    uVar1 = (int)(short)uVar2 >> 10;
    (&pCVar4->size)[lVar8] = uVar1;
    (&pCVar4->info)[lVar8] = uVar2 & 0xffff03ff;
    (&pCVar4->sib)[lVar8 * 2] = 0;
    uVar6 = uVar2 >> 0x1c;
    if ((uVar6 == 0xd) || (uVar6 == 7)) {
      lenx = strlen(__s);
      pGVar5 = lj_str_new(L,__s,lenx);
      pGVar5->marked = pGVar5->marked | 0x20;
      uVar2 = (uint)pGVar5;
      (&pCVar4->name)[lVar8].gcptr32 = uVar2;
      __s = __s + lenx + 1;
      uVar1 = uVar2 + 0xfb3ee249;
      uVar2 = (uVar2 ^ uVar1) - (uVar1 * 0x4000 | uVar1 >> 0x12);
      uVar2 = (uVar1 >> 0xd ^ uVar2) - (uVar2 >> 0x13);
LAB_0013e1b7:
      (&pCVar4->next)[lVar8 * 2] = pCVar3->hash[uVar2 & 0x7f];
      pCVar3->hash[uVar2 & 0x7f] = (CTypeID1)lVar7;
    }
    else {
      (&pCVar4->name)[lVar8].gcptr32 = 0;
      (&pCVar4->next)[lVar8 * 2] = 0;
      if (uVar6 != 5) {
        uVar2 = (uVar2 & 0xffff03ff ^ uVar1) - (uVar1 << 0xe | uVar1 >> 0x12);
        uVar2 = (uVar1 >> 0xd ^ uVar2) - (uVar2 >> 0x13);
        goto LAB_0013e1b7;
      }
    }
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 4;
    if (lVar7 == 0x60) {
      *(int *)((ulong)(L->glref).ptr32 + 0x194) = (int)pCVar3;
      return pCVar3;
    }
  } while( true );
}

Assistant:

CTState *lj_ctype_init(lua_State *L)
{
  CTState *cts = lj_mem_newt(L, sizeof(CTState), CTState);
  CType *ct = lj_mem_newvec(L, CTTYPETAB_MIN, CType);
  const char *name = lj_ctype_typenames;
  CTypeID id;
  memset(cts, 0, sizeof(CTState));
  cts->tab = ct;
  cts->sizetab = CTTYPETAB_MIN;
  cts->top = CTTYPEINFO_NUM;
  cts->L = NULL;
  cts->g = G(L);
  for (id = 0; id < CTTYPEINFO_NUM; id++, ct++) {
    CTInfo info = lj_ctype_typeinfo[id];
    ct->size = (CTSize)((int32_t)(info << 16) >> 26);
    ct->info = info & 0xffff03ffu;
    ct->sib = 0;
    if (ctype_type(info) == CT_KW || ctype_istypedef(info)) {
      size_t len = strlen(name);
      GCstr *str = lj_str_new(L, name, len);
      ctype_setname(ct, str);
      name += len+1;
      lj_ctype_addname(cts, ct, id);
    } else {
      setgcrefnull(ct->name);
      ct->next = 0;
      if (!ctype_isenum(info)) ctype_addtype(cts, ct, id);
    }
  }
  setmref(G(L)->ctype_state, cts);
  return cts;
}